

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O2

BigInt * __thiscall BigInt::operator-(BigInt *__return_storage_ptr__,BigInt *this,BigInt *b)

{
  BigInt temp;
  BigInt local_40;
  
  BigInt(&local_40,b);
  local_40.sign = (int)(b->sign == 0);
  *local_40.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
   _M_start = local_40.sign;
  add(__return_storage_ptr__,this,&local_40);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

BigInt BigInt::operator-(BigInt&& b) {
    BigInt temp = b;
    temp.set_sign(!b.get_positive_sign());
    return this->add(temp);
}